

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O0

void __thiscall
QDialogButtonBox::addButton(QDialogButtonBox *this,QAbstractButton *button,ButtonRole role)

{
  QDialogButtonBoxPrivate *file;
  int in_EDX;
  QWidget *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  AddRule unaff_retaddr;
  LayoutRule in_stack_00000008;
  ButtonRole in_stack_0000000c;
  QDialogButtonBoxPrivate *d;
  undefined4 in_stack_00000018;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int line;
  undefined4 in_stack_ffffffffffffffc0;
  QWidget *this_00;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  file = d_func((QDialogButtonBox *)0x66dca2);
  line = CONCAT13(1,(int3)in_stack_ffffffffffffffb4);
  if (-1 < in_EDX) {
    line = CONCAT13(8 < in_EDX,(int3)in_stack_ffffffffffffffb4);
  }
  if ((char)((uint)line >> 0x18) == '\0') {
    removeButton((QDialogButtonBox *)CONCAT44(line,in_stack_ffffffffffffffb0),
                 (QAbstractButton *)in_RDI);
    QWidget::setParent(this_00,in_RSI);
    QDialogButtonBoxPrivate::addButton
              ((QDialogButtonBoxPrivate *)CONCAT44(role,in_stack_00000018),(QAbstractButton *)d,
               in_stack_0000000c,in_stack_00000008,unaff_retaddr);
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_EDX,in_stack_ffffffffffffffc0),(char *)file,line,
               (char *)in_RDI);
    QMessageLogger::warning
              (local_28,"QDialogButtonBox::addButton: Invalid ButtonRole, button not added");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDialogButtonBox::addButton(QAbstractButton *button, ButtonRole role)
{
    Q_D(QDialogButtonBox);
    if (Q_UNLIKELY(role <= InvalidRole || role >= NRoles)) {
        qWarning("QDialogButtonBox::addButton: Invalid ButtonRole, button not added");
        return;
    }
    removeButton(button);
    button->setParent(this);
    d->addButton(button, role);
}